

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraint.h
# Opt level: O2

uint32 Clasp::ReduceStrategy::scoreBoth(ConstraintScore *sc)

{
  uint uVar1;
  int iVar2;
  
  uVar1 = sc->rep;
  iVar2 = 1;
  if ((uVar1 & 0x7f00000) != 0) {
    iVar2 = 0x80 - (uVar1 >> 0x14 & 0x7f);
  }
  return iVar2 * ((uVar1 & 0xfffff) + 1);
}

Assistant:

bool   hasLbd()   const  { return (rep & LBD_MASK) != 0; }